

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs.c
# Opt level: O0

int luv_fs_chown(lua_State *L)

{
  int *piVar1;
  int iVar2;
  char *pcVar3;
  lua_Integer lVar4;
  lua_Integer lVar5;
  uv_fs_t *req_00;
  luv_req_t *plVar6;
  uv_loop_t *loop;
  char *pcVar7;
  uv_fs_cb cb;
  bool bVar8;
  int nargs;
  luv_req_t *data;
  int sync;
  int ret;
  uv_fs_t *req;
  int ref;
  uv_uid_t gid;
  uv_uid_t uid;
  char *path;
  lua_State *L_local;
  
  pcVar3 = luaL_checklstring(L,1,(size_t *)0x0);
  lVar4 = luaL_checkinteger(L,2);
  lVar5 = luaL_checkinteger(L,3);
  iVar2 = luv_check_continuation(L,4);
  req_00 = (uv_fs_t *)lua_newuserdata(L,0x1b8);
  plVar6 = luv_setup_req(L,iVar2);
  req_00->data = plVar6;
  piVar1 = (int *)req_00->data;
  bVar8 = piVar1[1] == -2;
  loop = luv_loop(L);
  cb = luv_fs_cb;
  if (bVar8) {
    cb = (uv_fs_cb)0x0;
  }
  iVar2 = uv_fs_chown(loop,req_00,pcVar3,(uv_uid_t)lVar4,(uv_gid_t)lVar5,cb);
  if ((req_00->fs_type == UV_FS_ACCESS) || (-1 < iVar2)) {
    if (bVar8) {
      L_local._4_4_ = push_fs_result(L,req_00);
      if (req_00->fs_type != UV_FS_SCANDIR) {
        luv_cleanup_req(L,(luv_req_t *)req_00->data);
        req_00->data = (void *)0x0;
        uv_fs_req_cleanup(req_00);
      }
    }
    else {
      lua_rawgeti(L,-0xf4628,(long)*piVar1);
      L_local._4_4_ = 1;
    }
  }
  else {
    lua_pushnil(L);
    if (req_00->path == (char *)0x0) {
      pcVar3 = uv_err_name((int)req_00->result);
      pcVar7 = uv_strerror((int)req_00->result);
      lua_pushfstring(L,"%s: %s",pcVar3,pcVar7);
    }
    else {
      pcVar3 = uv_err_name((int)req_00->result);
      pcVar7 = uv_strerror((int)req_00->result);
      lua_pushfstring(L,"%s: %s: %s",pcVar3,pcVar7,req_00->path);
    }
    pcVar3 = uv_err_name((int)req_00->result);
    lua_pushstring(L,pcVar3);
    luv_cleanup_req(L,(luv_req_t *)req_00->data);
    req_00->data = (void *)0x0;
    uv_fs_req_cleanup(req_00);
    L_local._4_4_ = 3;
  }
  return L_local._4_4_;
}

Assistant:

static int luv_fs_chown(lua_State* L) {
  luv_ctx_t* ctx = luv_context(L);
  const char* path = luaL_checkstring(L, 1);
  uv_uid_t uid = luaL_checkinteger(L, 2);
  uv_uid_t gid = luaL_checkinteger(L, 3);
  int ref = luv_check_continuation(L, 4);
  uv_fs_t* req = (uv_fs_t*)lua_newuserdata(L, sizeof(*req));
  req->data = luv_setup_req(L, ctx, ref);
  FS_CALL(chown, req, path, uid, gid);
}